

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O3

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::defer_event<afsm::test::events::exec_prepared>
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,exec_prepared *event,event_priority_type priority)

{
  mutex_type *__mutex;
  test_fsm_observer *this_00;
  undefined8 uVar1;
  int iVar2;
  event_priority_type local_34;
  anon_class_16_3_3ecbcd59 local_30;
  
  __mutex = &this->deferred_mutex_;
  local_34 = priority;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    this_00 = (this->super_observer_wrapper<afsm::test::test_fsm_observer>).observer_.
              super___shared_ptr<afsm::test::test_fsm_observer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_00 != (test_fsm_observer *)0x0) {
      test::test_fsm_observer::
      defer_event<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::exec_prepared>
                (this_00,this,event);
    }
    local_30.priority = priority;
    local_30.this = this;
    std::
    vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>
    ::
    emplace_back<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::exec_prepared>(afsm::test::events::exec_prepared&&,int)::_lambda()_1_,int&>
              ((vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>
                *)&this->deferred_events_,&local_30,&local_34);
    std::
    push_heap<__gnu_cxx::__normal_iterator<std::pair<std::function<afsm::actions::event_process_result()>,int>*,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              ((this->deferred_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (this->deferred_events_).c.
               super__Vector_base<std::pair<std::function<afsm::actions::event_process_result_()>,_int>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar1 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar1);
}

Assistant:

void
    defer_event(Event&& event, event_priority_type priority)
    {
        lock_guard lock{deferred_mutex_};
        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace([&, evt, priority]() mutable {
            return process_event_dispatch(::std::move(evt), priority);
        }, priority);
    }